

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_microtime(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  undefined1 local_48 [8];
  timeval tv;
  sytime sTime;
  int bFloat;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  sTime.tm_usec._4_4_ = 0;
  gettimeofday((timeval *)local_48,(__timezone_ptr_t)0x0);
  tv.tv_usec = (__suseconds_t)local_48;
  if (0 < nArg) {
    sTime.tm_usec._4_4_ = jx9_value_to_bool(*apArg);
  }
  if (sTime.tm_usec._4_4_ == 0) {
    jx9_result_string_format(pCtx,"%ld %ld",tv.tv_sec,tv.tv_usec);
  }
  else {
    jx9_result_double(pCtx,(double)tv.tv_usec);
  }
  return 0;
}

Assistant:

static int jx9Builtin_microtime(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int bFloat = 0;
	sytime sTime;	
#if defined(__UNIXES__)
	struct timeval tv;
	gettimeofday(&tv, 0);
	sTime.tm_sec  = (long)tv.tv_sec;
	sTime.tm_usec = (long)tv.tv_usec;
#else
	time_t tt;
	time(&tt);
	sTime.tm_sec  = (long)tt;
	sTime.tm_usec = (long)(tt%SX_USEC_PER_SEC);
#endif /* __UNIXES__ */
	if( nArg > 0 ){
		bFloat = jx9_value_to_bool(apArg[0]);
	}
	if( bFloat ){
		/* Return as float */
		jx9_result_double(pCtx, (double)sTime.tm_sec);
	}else{
		/* Return as string */
		jx9_result_string_format(pCtx, "%ld %ld", sTime.tm_usec, sTime.tm_sec);
	}
	return JX9_OK;
}